

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O1

void symtab_del(symtab *tab)

{
  long lVar1;
  long lVar2;
  
  if (0 < tab->symsnum) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      free(*(void **)((long)&tab->syms->name + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < tab->symsnum);
  }
  free(tab->buckets);
  free(tab->syms);
  free(tab);
  return;
}

Assistant:

void symtab_del(struct symtab *tab) {
	int i;
	for (i = 0; i < tab->symsnum; i++)
		free(tab->syms[i].name);
	free(tab->buckets);
	free(tab->syms);
	free(tab);
}